

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ssize_t ossl_send(Curl_cfilter *cf,Curl_easy *data,void *mem,size_t len,CURLcode *curlcode)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint *puVar5;
  CURLcode CVar6;
  size_t sVar7;
  char *pcVar8;
  char error_buffer [256];
  char acStack_138 [264];
  
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  ERR_clear_error();
  sVar7 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar7 = len;
  }
  uVar2 = SSL_write(*(SSL **)(lVar1 + 8),mem,(int)sVar7);
  if (0 < (int)uVar2) {
    *curlcode = CURLE_OK;
    return (ulong)uVar2;
  }
  iVar3 = SSL_get_error(*(SSL **)(lVar1 + 8),uVar2);
  switch(iVar3) {
  case 0:
    pcVar8 = "SSL_ERROR_NONE";
    break;
  case 1:
    uVar4 = ERR_get_error();
    pcVar8 = ossl_strerror(uVar4,acStack_138,0x100);
    Curl_failf(data,"SSL_write() error: %s",pcVar8);
    goto LAB_006ac24a;
  case 2:
  case 3:
    *curlcode = CURLE_AGAIN;
    return -1;
  case 4:
    pcVar8 = "SSL_ERROR_WANT_X509_LOOKUP";
    break;
  case 5:
    puVar5 = (uint *)__errno_location();
    CVar6 = CURLE_AGAIN;
    if (*(int *)(lVar1 + 0x20) != 0x51) {
      uVar2 = *puVar5;
      uVar4 = ERR_get_error();
      if (uVar4 == 0) {
        if (uVar2 == 0) {
          curl_msnprintf(acStack_138,0x100,"%s","SSL_ERROR_SYSCALL");
        }
        else {
          Curl_strerror(uVar2,acStack_138,0x100);
        }
      }
      else {
        ossl_strerror(uVar4,acStack_138,0x100);
      }
      Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",acStack_138,(ulong)uVar2);
      CVar6 = CURLE_SEND_ERROR;
    }
    *curlcode = CVar6;
    return -1;
  case 6:
    pcVar8 = "SSL_ERROR_ZERO_RETURN";
    break;
  case 7:
    pcVar8 = "SSL_ERROR_WANT_CONNECT";
    break;
  case 8:
    pcVar8 = "SSL_ERROR_WANT_ACCEPT";
    break;
  case 9:
    pcVar8 = "SSL_ERROR_WANT_ASYNC";
    break;
  case 10:
    pcVar8 = "SSL_ERROR_WANT_ASYNC_JOB";
    break;
  default:
    pcVar8 = "SSL_ERROR unknown";
  }
  puVar5 = (uint *)__errno_location();
  Curl_failf(data,"OpenSSL SSL_write: %s, errno %d",pcVar8,(ulong)*puVar5);
LAB_006ac24a:
  *curlcode = CURLE_SEND_ERROR;
  return -1;
}

Assistant:

static ssize_t ossl_send(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         const void *mem,
                         size_t len,
                         CURLcode *curlcode)
{
  /* SSL_write() is said to return 'int' while write() and send() returns
     'size_t' */
  int err;
  char error_buffer[256];
  sslerr_t sslerror;
  int memlen;
  int rc;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ssl_backend_data *backend =
    (struct ossl_ssl_backend_data *)connssl->backend;

  (void)data;
  DEBUGASSERT(backend);

  ERR_clear_error();

  memlen = (len > (size_t)INT_MAX) ? INT_MAX : (int)len;
  rc = SSL_write(backend->handle, mem, memlen);

  if(rc <= 0) {
    err = SSL_get_error(backend->handle, rc);

    switch(err) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* The operation did not complete; the same TLS/SSL I/O function
         should be called again later. This is basically an EWOULDBLOCK
         equivalent. */
      *curlcode = CURLE_AGAIN;
      rc = -1;
      goto out;
    case SSL_ERROR_SYSCALL:
    {
      int sockerr = SOCKERRNO;

      if(backend->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        rc = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if(sslerror)
        ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
      else if(sockerr)
        Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
      else
        msnprintf(error_buffer, sizeof(error_buffer), "%s",
                  SSL_ERROR_to_str(err));

      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            error_buffer, sockerr);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    case SSL_ERROR_SSL: {
      /*  A failure in the SSL library occurred, usually a protocol error.
          The OpenSSL error queue contains more information on the error. */
      sslerror = ERR_get_error();
      failf(data, "SSL_write() error: %s",
            ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)));
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
    default:
      /* a true error */
      failf(data, OSSL_PACKAGE " SSL_write: %s, errno %d",
            SSL_ERROR_to_str(err), SOCKERRNO);
      *curlcode = CURLE_SEND_ERROR;
      rc = -1;
      goto out;
    }
  }
  *curlcode = CURLE_OK;

out:
  return (ssize_t)rc; /* number of bytes */
}